

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderCommonFunctionTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TruncCase::getInputValues(TruncCase *this,int numValues,void **values)

{
  deUint32 dVar1;
  DataType dataType;
  Precision PVar2;
  int iVar3;
  char *str;
  const_reference pvVar4;
  vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
  *this_00;
  float fVar5;
  float maxValue;
  Float<unsigned_short,_5,_10,_15,_3U> local_9a;
  int local_98;
  int local_94;
  int ndx;
  int scalarNdx;
  int caseNdx;
  int numSpecialCases;
  float specialCases [6];
  int scalarSize;
  Precision precision;
  DataType type;
  Random rnd;
  Vec2 ranges [3];
  void **values_local;
  int numValues_local;
  TruncCase *this_local;
  
  ranges[2].m_data = (float  [2])values;
  tcu::Vector<float,_2>::Vector((Vector<float,_2> *)&rnd.m_rnd.z,-2.0,2.0);
  tcu::Vector<float,_2>::Vector(ranges,-1000.0,1000.0);
  tcu::Vector<float,_2>::Vector(ranges + 1,-1e+07,1e+07);
  str = tcu::TestNode::getName((TestNode *)this);
  dVar1 = deStringHash(str);
  de::Random::Random((Random *)&precision,dVar1 ^ 0xac23f);
  this_00 = &(this->super_CommonFunctionCase).m_spec.inputs;
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  dataType = glu::VarType::getBasicType(&pvVar4->varType);
  pvVar4 = std::
           vector<deqp::gls::ShaderExecUtil::Symbol,_std::allocator<deqp::gls::ShaderExecUtil::Symbol>_>
           ::operator[](this_00,0);
  PVar2 = glu::VarType::getPrecision(&pvVar4->varType);
  iVar3 = glu::getDataTypeScalarSize(dataType);
  _caseNdx = 0x8000000000000000;
  specialCases[0] = -0.9;
  specialCases[1] = 0.9;
  specialCases[2] = 1.0;
  specialCases[3] = -1.0;
  scalarNdx = 6;
  for (ndx = 0; ndx < 6; ndx = ndx + 1) {
    for (local_94 = 0; local_94 < iVar3; local_94 = local_94 + 1) {
      *(int *)(*(long *)ranges[2].m_data + (long)(ndx * iVar3 + local_94) * 4) = (&caseNdx)[ndx];
    }
  }
  fVar5 = tcu::Vector<float,_2>::x(ranges + ((ulong)PVar2 - 1));
  maxValue = tcu::Vector<float,_2>::y(ranges + ((ulong)PVar2 - 1));
  fillRandomScalars<float>
            ((Random *)&precision,fVar5,maxValue,
             (void *)(*(long *)ranges[2].m_data + (long)(iVar3 * 6) * 4),(numValues + -6) * iVar3,0)
  ;
  if (PVar2 == PRECISION_MEDIUMP) {
    for (local_98 = 0; local_98 < numValues * iVar3; local_98 = local_98 + 1) {
      tcu::Float<unsigned_short,_5,_10,_15,_3U>::Float
                (&local_9a,*(float *)(*(long *)ranges[2].m_data + (long)local_98 * 4));
      fVar5 = tcu::Float<unsigned_short,_5,_10,_15,_3U>::asFloat(&local_9a);
      *(float *)(*(long *)ranges[2].m_data + (long)local_98 * 4) = fVar5;
    }
  }
  de::Random::~Random((Random *)&precision);
  return;
}

Assistant:

void getInputValues (int numValues, void* const* values) const
	{
		const Vec2 ranges[] =
		{
			Vec2(-2.0f,		2.0f),	// lowp
			Vec2(-1e3f,		1e3f),	// mediump
			Vec2(-1e7f,		1e7f)	// highp
		};

		de::Random				rnd				(deStringHash(getName()) ^ 0xac23fu);
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const float				specialCases[]	= { 0.0f, -0.0f, -0.9f, 0.9f, 1.0f, -1.0f };
		const int				numSpecialCases	= DE_LENGTH_OF_ARRAY(specialCases);

		// Special cases
		for (int caseNdx = 0; caseNdx < numSpecialCases; caseNdx++)
		{
			for (int scalarNdx = 0; scalarNdx < scalarSize; scalarNdx++)
				((float*)values[0])[caseNdx*scalarSize + scalarNdx] = specialCases[caseNdx];
		}

		// Random cases.
		fillRandomScalars(rnd, ranges[precision].x(), ranges[precision].y(), (float*)values[0] + scalarSize*numSpecialCases, (numValues-numSpecialCases)*scalarSize);

		// If precision is mediump, make sure values can be represented in fp16 exactly
		if (precision == glu::PRECISION_MEDIUMP)
		{
			for (int ndx = 0; ndx < numValues*scalarSize; ndx++)
				((float*)values[0])[ndx] = tcu::Float16(((float*)values[0])[ndx]).asFloat();
		}
	}